

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::strTree<char_const(&)[6],unsigned_int,char_const(&)[3],unsigned_int,char_const(&)[2]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [6],uint *params_1,
          char (*params_2) [3],uint *params_3,char (*params_4) [2])

{
  ArrayPtr<const_char> *in_stack_ffffffffffffff68;
  undefined1 local_90 [16];
  CappedArray<char,_14UL> local_80;
  undefined1 local_68 [16];
  undefined1 local_58 [40];
  
  local_90._8_8_ = strlen((char *)this);
  local_90._0_8_ = this;
  _::Stringifier::operator*
            ((CappedArray<char,_14UL> *)(local_90 + 0x10),(Stringifier *)&_::STR,*(uint *)*params);
  local_58._8_8_ = strlen((char *)params_1);
  local_58._0_8_ = params_1;
  _::Stringifier::operator*
            ((CappedArray<char,_14UL> *)(local_58 + 0x10),(Stringifier *)&_::STR,*(uint *)params_2);
  local_68._8_8_ = strlen((char *)params_3);
  local_68._0_8_ = params_3;
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)local_90,(ArrayPtr<const_char> *)(local_90 + 0x10)
             ,(CappedArray<char,_14UL> *)local_58,(ArrayPtr<const_char> *)(local_58 + 0x10),
             (CappedArray<char,_14UL> *)(local_90 + 0x28),in_stack_ffffffffffffff68);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}